

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderPackingFunctionCase::~ShaderPackingFunctionCase
          (ShaderPackingFunctionCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPackingFunctionCase_01e4c770;
  deinit(this);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec(&this->m_spec);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ShaderPackingFunctionCase::~ShaderPackingFunctionCase (void)
{
	ShaderPackingFunctionCase::deinit();
}